

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

ssize_t sftp_write(LIBSSH2_SFTP_HANDLE *handle,char *buffer,size_t count)

{
  libssh2_nonblocking_states lVar1;
  uint32_t value;
  int iVar2;
  char *pcVar3;
  list_node *entry;
  ssize_t sVar4;
  long lVar5;
  sftp_pipeline_chunk *psVar6;
  LIBSSH2_SFTP_HANDLE *pLVar7;
  LIBSSH2_SFTP_HANDLE *local_b8;
  LIBSSH2_SFTP *local_b0;
  ssize_t ret;
  uint32_t request_id;
  uint32_t size;
  size_t already;
  size_t org_count;
  size_t acked;
  sftp_pipeline_chunk *next;
  sftp_pipeline_chunk *chunk;
  ssize_t rc;
  uchar *data;
  uchar *s;
  uint32_t packet_len;
  uint32_t retcode;
  size_t data_len;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SFTP *sftp;
  size_t count_local;
  char *buffer_local;
  LIBSSH2_SFTP_HANDLE *handle_local;
  
  channel = (LIBSSH2_CHANNEL *)handle->sftp;
  session = (LIBSSH2_SESSION *)(channel->node).next;
  data_len = (size_t)session->kex_prefs;
  _packet_len = 0;
  rc = 0;
  org_count = 0;
  lVar1 = *(libssh2_nonblocking_states *)((long)&(channel->setenv_packet_requirev_state).start + 4);
  count_local = (size_t)buffer;
  buffer_local = (char *)handle;
  if ((lVar1 == libssh2_NB_state_idle) ||
     (sftp = (LIBSSH2_SFTP *)count, lVar1 != libssh2_NB_state_sent)) {
    *(uint32_t *)&(channel->local).close = 0;
    pcVar3 = (handle->u).dir.next_name +
             ((long)(handle->u).dir.names_packet - (handle->u).file.offset);
    if (count < pcVar3) {
      sftp = (LIBSSH2_SFTP *)0x0;
    }
    else {
      count_local = (size_t)(buffer + (long)pcVar3);
      sftp = (LIBSSH2_SFTP *)(count - (long)pcVar3);
    }
    *(libssh2_nonblocking_states *)((long)&(channel->setenv_packet_requirev_state).start + 4) =
         libssh2_NB_state_idle;
    for (; sftp != (LIBSSH2_SFTP *)0x0;
        sftp = (LIBSSH2_SFTP *)((long)sftp - ((ulong)local_b0 & 0xffffffff))) {
      if (sftp < (LIBSSH2_SFTP *)0x7531) {
        local_b0 = sftp;
      }
      else {
        local_b0 = (LIBSSH2_SFTP *)0x7530;
      }
      s._0_4_ = (int)*(undefined8 *)(buffer_local + 0x120) + (int)local_b0 + 0x19;
      entry = (list_node *)(**(code **)(data_len + 8))((ulong)(uint)s + 0x40,data_len);
      if (entry == (list_node *)0x0) {
        iVar2 = _libssh2_error((LIBSSH2_SESSION *)data_len,-6,"malloc fail for FXP_WRITE");
        return (long)iVar2;
      }
      entry[1].prev = (list_node *)((ulong)local_b0 & 0xffffffff);
      entry[1].head = (list_head *)0x0;
      entry[2].next = (list_node *)(ulong)(uint)s;
      data = (uchar *)((long)&entry[2].prev + 4);
      _libssh2_store_u32(&data,(uint)s - 4);
      *data = '\x06';
      value = *(uint32_t *)&(channel->node).prev;
      *(uint32_t *)&(channel->node).prev = value + 1;
      *(uint32_t *)&entry[2].prev = value;
      data = data + 1;
      _libssh2_store_u32(&data,value);
      _libssh2_store_str(&data,buffer_local + 0x20,*(size_t *)(buffer_local + 0x120));
      _libssh2_store_u64(&data,*(libssh2_uint64_t *)(buffer_local + 0x138));
      *(ulong *)(buffer_local + 0x138) =
           ((ulong)local_b0 & 0xffffffff) + *(long *)(buffer_local + 0x138);
      _libssh2_store_str(&data,(char *)count_local,(ulong)local_b0 & 0xffffffff);
      _libssh2_list_add((list_head *)(buffer_local + 0x178),entry);
      count_local = count_local + ((ulong)local_b0 & 0xffffffff);
    }
    for (next = (sftp_pipeline_chunk *)_libssh2_list_first((list_head *)(buffer_local + 0x178));
        next != (sftp_pipeline_chunk *)0x0;
        next = (sftp_pipeline_chunk *)_libssh2_list_next(&next->node)) {
      if (next->lefttosend != 0) {
        sVar4 = _libssh2_channel_write
                          ((LIBSSH2_CHANNEL *)session,0,next->packet + next->sent,next->lefttosend);
        if (sVar4 < 0) {
          return sVar4;
        }
        next->lefttosend = next->lefttosend - sVar4;
        next->sent = sVar4 + next->sent;
        if (next->lefttosend != 0) break;
      }
    }
  }
  *(undefined4 *)((long)&(channel->setenv_packet_requirev_state).start + 4) = 0;
  next = (sftp_pipeline_chunk *)_libssh2_list_first((list_head *)(buffer_local + 0x178));
  while( true ) {
    if (((next == (sftp_pipeline_chunk *)0x0) || (next->lefttosend != 0)) || (org_count != 0)) {
      pLVar7 = (LIBSSH2_SFTP_HANDLE *)(*(long *)(buffer_local + 0x140) + org_count);
      if (pLVar7 == (LIBSSH2_SFTP_HANDLE *)0x0) {
        handle_local = (LIBSSH2_SFTP_HANDLE *)0x0;
      }
      else {
        local_b8 = (LIBSSH2_SFTP_HANDLE *)count;
        if (pLVar7 < count) {
          local_b8 = pLVar7;
        }
        *(long *)(buffer_local + 0x140) = (long)pLVar7 - (long)local_b8;
        handle_local = local_b8;
      }
      return (ssize_t)handle_local;
    }
    iVar2 = sftp_packet_require((LIBSSH2_SFTP *)channel,'e',next->request_id,(uchar **)&rc,
                                (size_t *)&packet_len,9);
    lVar5 = (long)iVar2;
    if (lVar5 == -0x26) {
      if (_packet_len != 0) {
        (**(code **)(data_len + 0x18))(rc,data_len);
      }
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"FXP write packet too short");
      return (long)iVar2;
    }
    if (lVar5 < 0) break;
    s._4_4_ = _libssh2_ntohu32((uchar *)(rc + 5));
    (**(code **)(data_len + 0x18))(rc,data_len);
    (channel->local).close = s._4_1_;
    (channel->local).eof = s._5_1_;
    (channel->local).extended_data_ignore_mode = s._6_1_;
    (channel->local).field_0x13 = s._7_1_;
    if (s._4_4_ != 0) {
      sftp_packetlist_flush((LIBSSH2_SFTP_HANDLE *)buffer_local);
      *(long *)(buffer_local + 0x130) =
           *(long *)(buffer_local + 0x130) - *(long *)(buffer_local + 0x140);
      *(undefined8 *)(buffer_local + 0x138) = *(undefined8 *)(buffer_local + 0x130);
      buffer_local[0x140] = '\0';
      buffer_local[0x141] = '\0';
      buffer_local[0x142] = '\0';
      buffer_local[0x143] = '\0';
      buffer_local[0x144] = '\0';
      buffer_local[0x145] = '\0';
      buffer_local[0x146] = '\0';
      buffer_local[0x147] = '\0';
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"FXP write failed");
      return (long)iVar2;
    }
    org_count = next->len;
    *(size_t *)(buffer_local + 0x130) = next->len + *(long *)(buffer_local + 0x130);
    psVar6 = (sftp_pipeline_chunk *)_libssh2_list_next(&next->node);
    _libssh2_list_remove(&next->node);
    (**(code **)(data_len + 0x18))(next,data_len);
    next = psVar6;
  }
  if (lVar5 != -0x25) {
    return lVar5;
  }
  *(undefined4 *)((long)&(channel->setenv_packet_requirev_state).start + 4) = 3;
  return -0x25;
}

Assistant:

static ssize_t sftp_write(LIBSSH2_SFTP_HANDLE *handle, const char *buffer,
                          size_t count)
{
    LIBSSH2_SFTP *sftp = handle->sftp;
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t data_len = 0;
    uint32_t retcode;
    uint32_t packet_len;
    unsigned char *s, *data = NULL;
    ssize_t rc;
    struct sftp_pipeline_chunk *chunk;
    struct sftp_pipeline_chunk *next;
    size_t acked = 0;
    size_t org_count = count;
    size_t already;

    switch(sftp->write_state) {
    default:
    case libssh2_NB_state_idle:
        sftp->last_errno = LIBSSH2_FX_OK;

        /* Number of bytes sent off that haven't been acked and therefore we
           will get passed in here again.

           Also, add up the number of bytes that actually already have been
           acked but we haven't been able to return as such yet, so we will
           get that data as well passed in here again.
        */
        already = (size_t)(handle->u.file.offset_sent -
                           handle->u.file.offset)+
            handle->u.file.acked;

        if(count >= already) {
            /* skip the part already made into packets */
            buffer += already;
            count -= already;
        }
        else
            /* there is more data already fine than what we got in this call */
            count = 0;

        sftp->write_state = libssh2_NB_state_idle;
        while(count) {
            /* TODO: Possibly this should have some logic to prevent a very
               very small fraction to be left but lets ignore that for now */
            uint32_t size =
                (uint32_t)(LIBSSH2_MIN(MAX_SFTP_OUTGOING_SIZE, count));
            uint32_t request_id;

            /* 25 = packet_len(4) + packet_type(1) + request_id(4) +
               handle_len(4) + offset(8) + count(4) */
            packet_len = (uint32_t)(handle->handle_len + size + 25);

            chunk = LIBSSH2_ALLOC(session, packet_len +
                                  sizeof(struct sftp_pipeline_chunk));
            if(!chunk)
                return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                      "malloc fail for FXP_WRITE");

            chunk->len = size;
            chunk->sent = 0;
            chunk->lefttosend = packet_len;

            s = chunk->packet;
            _libssh2_store_u32(&s, packet_len - 4);

            *(s++) = SSH_FXP_WRITE;
            request_id = sftp->request_id++;
            chunk->request_id = request_id;
            _libssh2_store_u32(&s, request_id);
            _libssh2_store_str(&s, handle->handle, handle->handle_len);
            _libssh2_store_u64(&s, handle->u.file.offset_sent);
            handle->u.file.offset_sent += size; /* advance offset at once */
            _libssh2_store_str(&s, buffer, size);

            /* add this new entry LAST in the list */
            _libssh2_list_add(&handle->packet_list, &chunk->node);

            buffer += size;
            count -= size; /* deduct the size we used, as we might have
                              to create more packets */
        }

        /* move through the WRITE packets that haven't been sent and send as
           many as possible - remember that we don't block */
        chunk = _libssh2_list_first(&handle->packet_list);

        while(chunk) {
            if(chunk->lefttosend) {
                rc = _libssh2_channel_write(channel, 0,
                                            &chunk->packet[chunk->sent],
                                            chunk->lefttosend);
                if(rc < 0)
                    /* remain in idle state */
                    return rc;

                /* remember where to continue sending the next time */
                chunk->lefttosend -= rc;
                chunk->sent += rc;

                if(chunk->lefttosend)
                    /* data left to send, get out of loop */
                    break;
            }

            /* move on to the next chunk with data to send */
            chunk = _libssh2_list_next(&chunk->node);
        }

        LIBSSH2_FALLTHROUGH();

    case libssh2_NB_state_sent:

        sftp->write_state = libssh2_NB_state_idle;
        /*
         * Count all ACKed packets
         */
        chunk = _libssh2_list_first(&handle->packet_list);

        while(chunk) {
            if(chunk->lefttosend)
                /* if the chunk still has data left to send, we shouldn't wait
                   for an ACK for it just yet */
                break;

            else if(acked)
                /* if we have sent data that is acked, we must return that
                   info before we call a function that might return EAGAIN */
                break;

            /* we check the packets in order */
            rc = sftp_packet_require(sftp, SSH_FXP_STATUS,
                                     chunk->request_id, &data, &data_len, 9);
            if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
                if(data_len > 0) {
                    LIBSSH2_FREE(session, data);
                }
                return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                      "FXP write packet too short");
            }
            else if(rc < 0) {
                if(rc == LIBSSH2_ERROR_EAGAIN)
                    sftp->write_state = libssh2_NB_state_sent;
                return rc;
            }

            retcode = _libssh2_ntohu32(data + 5);
            LIBSSH2_FREE(session, data);

            sftp->last_errno = retcode;
            if(retcode == LIBSSH2_FX_OK) {
                acked += chunk->len; /* number of payload data that was acked
                                        here */

                /* we increase the offset value for all acks */
                handle->u.file.offset += chunk->len;

                next = _libssh2_list_next(&chunk->node);

                _libssh2_list_remove(&chunk->node); /* remove from list */
                LIBSSH2_FREE(session, chunk); /* free memory */

                chunk = next;
            }
            else {
                /* flush all pending packets from the outgoing list */
                sftp_packetlist_flush(handle);

                /* since we return error now, the application will not get any
                   outstanding data acked, so we need to rewind the offset to
                   where the application knows it has reached with acked
                   data */
                handle->u.file.offset -= handle->u.file.acked;

                /* then reset the offset_sent to be the same as the offset */
                handle->u.file.offset_sent = handle->u.file.offset;

                /* clear the acked counter since we can have no pending data to
                   ack after an error */
                handle->u.file.acked = 0;

                /* the server returned an error for that written chunk,
                   propagate this back to our parent function */
                return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                      "FXP write failed");
            }
        }
        break;
    }

    /* if there were acked data in a previous call that wasn't returned then,
       add that up and try to return it all now. This can happen if the app
       first sends a huge buffer of data, and then in a second call it sends a
       smaller one. */
    acked += handle->u.file.acked;

    if(acked) {
        ssize_t ret = LIBSSH2_MIN(acked, org_count);
        /* we got data acked so return that amount, but no more than what
           was asked to get sent! */

        /* store the remainder. 'ret' is always equal to or less than 'acked'
           here */
        handle->u.file.acked = acked - ret;

        return ret;
    }

    else
        return 0; /* nothing was acked, and no EAGAIN was received! */
}